

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O0

type * __thiscall
Disa::projection_orthogonal<double,0ul,0ul>
          (type *__return_storage_ptr__,Disa *this,Vector_Dense<double,_0UL> *vector_0,
          Vector_Dense<double,_0UL> *vector_1)

{
  Vector_Dense<double,_0UL> *pVVar1;
  Vector_Dense<double,_0UL> *vector_1_00;
  ostream *poVar2;
  size_type sVar3;
  type local_170;
  anon_class_8_1_5812cdb2 local_158;
  function<double_(unsigned_long)> local_150;
  undefined1 local_130 [8];
  _return_vector vector;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<double,_std::allocator<double>_> *local_20;
  Vector_Dense<double,_0UL> *vector_1_local;
  Vector_Dense<double,_0UL> *vector_0_local;
  
  local_20 = &vector_0->super_vector<double,_std::allocator<double>_>;
  vector_1_local = (Vector_Dense<double,_0UL> *)this;
  vector_0_local = __return_storage_ptr__;
  pVVar1 = (Vector_Dense<double,_0UL> *)
           std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)this);
  vector_1_00 = (Vector_Dense<double,_0UL> *)
                std::vector<double,_std::allocator<double>_>::size(local_20);
  if (pVVar1 != vector_1_00) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001b55e8;
    console_format_abi_cxx11_
              (&local_40,(Disa *)0x0,(Log_Level)&local_48,(source_location *)vector_1_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      (&vector_1_local->super_vector<double,_std::allocator<double>_>);
    std::__cxx11::to_string(&local_f8,sVar3);
    std::operator+(&local_d8,"Incompatible vector sizes, ",&local_f8);
    std::operator+(&local_b8,&local_d8," vs. ");
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_20);
    std::__cxx11::to_string
              ((string *)
               &vector.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,sVar3);
    std::operator+(&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vector.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_78,&local_98,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_78);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string
              ((string *)
               &vector.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  local_158.vector_0 = vector_1_local;
  std::function<double(unsigned_long)>::
  function<Disa::projection_orthogonal<double,0ul,0ul>(Disa::Vector_Dense<double,0ul>const&,Disa::Vector_Dense<double,0ul>const&)::_lambda(unsigned_long)_1_,void>
            ((function<double(unsigned_long)> *)&local_150,&local_158);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(local_20);
  Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_130,&local_150,sVar3);
  std::function<double_(unsigned_long)>::~function(&local_150);
  projection_tangent<double,0ul,0ul>
            (&local_170,(Disa *)vector_1_local,(Vector_Dense<double,_0UL> *)local_20,vector_1_00);
  operator-(__return_storage_ptr__,(Vector_Dense<double,_0UL> *)local_130,&local_170);
  Vector_Dense<double,_0UL>::~Vector_Dense(&local_170);
  Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

constexpr typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type
projection_orthogonal(const Vector_Dense<_type, _size_0>& vector_0, const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  _return_vector vector([&](const std::size_t index) { return vector_0[index]; }, vector_1.size());
  return vector - projection_tangent(vector_0, vector_1);
}